

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastEr0R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  ushort *puVar2;
  uint uVar3;
  RepeatedField<int> *this;
  ulong uVar4;
  char *pcVar5;
  uint *puVar6;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar7;
  ushort *puVar8;
  
  if (data.field_0._0_1_ == '\0') {
    aVar7 = data.field_0;
    this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
    cVar1 = *ptr;
    puVar2 = (ushort *)(ptr + 2);
    while (puVar8 = puVar2, *(byte *)((long)puVar8 + -1) <= data.field_0._3_1_) {
      RepeatedField<int>::Add(this,(uint)*(byte *)((long)puVar8 + -1));
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar8) {
        if ((ulong)table->has_bits_offset != 0) {
          puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
          *puVar6 = *puVar6 | (uint)hasbits;
        }
        return (char *)puVar8;
      }
      puVar2 = puVar8 + 1;
      if ((char)*puVar8 != cVar1) {
        uVar3 = (uint)table->fast_idx_mask & (uint)*puVar8;
        if ((uVar3 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar4 = (ulong)(uVar3 & 0xfffffff8);
        pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                   (msg,puVar8,ctx,
                                    (ulong)*puVar8 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2)
                                    ,table,hasbits);
        return pcVar5;
      }
    }
    ptr = (char *)(puVar8 + -1);
    data.field_0 = aVar7;
  }
  pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr0R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnumSmallRange<uint8_t, 0>(
      PROTOBUF_TC_PARAM_PASS);
}